

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O0

NetlistVariableAlias * __thiscall
netlist::Netlist::addVariableAlias(Netlist *this,Symbol *symbol,ConstantRange overlap)

{
  pointer this_00;
  long in_RDI;
  NetlistVariableAlias *node;
  __single_object nodePtr;
  string *in_stack_000001f8;
  Symbol *in_stack_00000200;
  value_type *in_stack_ffffffffffffff88;
  vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
  *in_stack_ffffffffffffff90;
  Symbol *in_stack_ffffffffffffffb8;
  unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> local_40 [3];
  NetlistVariableAlias *local_28;
  ConstantRange local_20 [4];
  
  std::make_unique<netlist::NetlistVariableAlias,slang::ast::Symbol_const&,slang::ConstantRange&>
            (in_stack_ffffffffffffffb8,local_20);
  this_00 = std::
            unique_ptr<netlist::NetlistVariableAlias,_std::default_delete<netlist::NetlistVariableAlias>_>
            ::operator->((unique_ptr<netlist::NetlistVariableAlias,_std::default_delete<netlist::NetlistVariableAlias>_>
                          *)0x1f8f30);
  local_28 = NetlistNode::as<netlist::NetlistVariableAlias>(&this_00->super_NetlistNode);
  slang::ast::Symbol::appendHierarchicalPath(in_stack_00000200,in_stack_000001f8);
  std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>::
  unique_ptr<netlist::NetlistVariableAlias,std::default_delete<netlist::NetlistVariableAlias>,void>
            (local_40,(unique_ptr<netlist::NetlistVariableAlias,_std::default_delete<netlist::NetlistVariableAlias>_>
                       *)(in_RDI + 8));
  std::
  vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
  ::push_back(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>::~unique_ptr
            ((unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *)
             in_stack_ffffffffffffff90);
  std::
  unique_ptr<netlist::NetlistVariableAlias,_std::default_delete<netlist::NetlistVariableAlias>_>::
  ~unique_ptr((unique_ptr<netlist::NetlistVariableAlias,_std::default_delete<netlist::NetlistVariableAlias>_>
               *)local_28);
  return local_28;
}

Assistant:

NetlistVariableAlias& addVariableAlias(const ast::Symbol& symbol, ConstantRange overlap) {
        auto nodePtr = std::make_unique<NetlistVariableAlias>(symbol, overlap);
        auto& node = nodePtr->as<NetlistVariableAlias>();
        symbol.appendHierarchicalPath(node.hierarchicalPath);
        nodes.push_back(std::move(nodePtr));
        DEBUG_PRINT("New node: variable alias {}\n", node.hierarchicalPath);
        return node;
    }